

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

void __thiscall
Compiler::detect_error<ParsedGame::ObjectsTokenType>
          (Compiler *this,Token<ParsedGame::ObjectsTokenType> *p_token,string *p_error_msg,
          bool p_is_warning)

{
  element_type *peVar1;
  uint uVar2;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48 [39];
  byte local_21;
  string *psStack_20;
  bool p_is_warning_local;
  string *p_error_msg_local;
  Token<ParsedGame::ObjectsTokenType> *p_token_local;
  Compiler *this_local;
  
  if (!p_is_warning) {
    this->m_has_error = true;
  }
  local_21 = p_is_warning;
  psStack_20 = p_error_msg;
  p_error_msg_local = (string *)p_token;
  p_token_local = (Token<ParsedGame::ObjectsTokenType> *)this;
  peVar1 = std::__shared_ptr_access<PSLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<PSLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      this);
  uVar2 = (uint)local_21;
  std::__cxx11::string::string(local_48,(string *)&m_compiler_log_cat_abi_cxx11_);
  std::__cxx11::to_string(&local_c8,p_token->token_line);
  std::operator+(&local_a8,"(l.",&local_c8);
  std::operator+(&local_88,&local_a8,") : ");
  std::operator+(&local_68,&local_88,p_error_msg);
  (*peVar1->_vptr_PSLogger[2])(peVar1,(ulong)(4 - (uVar2 & 1)),local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

void Compiler::detect_error(Token<T> p_token, string p_error_msg, bool p_is_warning /*= false*/)
{
    if(!p_is_warning)
    {
        m_has_error = true;
    }
    m_logger->log(p_is_warning ? PSLogger::LogType::Warning : PSLogger::LogType::Error, m_compiler_log_cat, "(l." + to_string(p_token.token_line) + ") : " + p_error_msg);
}